

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

void __thiscall leveldb::DBImpl::CleanupCompaction(DBImpl *this,CompactionState *compact)

{
  TableBuilder *this_00;
  pointer pOVar1;
  ulong uVar2;
  long lVar3;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar4;
  
  if (compact->builder == (TableBuilder *)0x0) {
    if (compact->outfile != (WritableFile *)0x0) {
      __assert_fail("compact->outfile == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                    ,0x311,"void leveldb::DBImpl::CleanupCompaction(CompactionState *)");
    }
  }
  else {
    TableBuilder::Abandon(compact->builder);
    this_00 = compact->builder;
    if (this_00 != (TableBuilder *)0x0) {
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00);
    }
  }
  if (compact->outfile != (WritableFile *)0x0) {
    (*compact->outfile->_vptr_WritableFile[1])();
  }
  pOVar1 = (compact->outputs).
           super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((compact->outputs).
      super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
      ._M_impl.super__Vector_impl_data._M_finish != pOVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      pVar4 = std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::equal_range(&(this->pending_outputs_)._M_t,
                            (key_type *)((long)&pOVar1->number + lVar3));
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_M_erase_aux(&(this->pending_outputs_)._M_t,(_Base_ptr)pVar4.first._M_node,
                     (_Base_ptr)pVar4.second._M_node);
      uVar2 = uVar2 + 1;
      pOVar1 = (compact->outputs).
               super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x50;
    } while (uVar2 < (ulong)(((long)(compact->outputs).
                                    super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1 >> 4)
                            * -0x3333333333333333));
  }
  if (compact != (CompactionState *)0x0) {
    std::
    vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
    ::~vector(&compact->outputs);
    operator_delete(compact);
    return;
  }
  return;
}

Assistant:

void DBImpl::CleanupCompaction(CompactionState* compact) {
  mutex_.AssertHeld();
  if (compact->builder != nullptr) {
    // May happen if we get a shutdown call in the middle of compaction
    compact->builder->Abandon();
    delete compact->builder;
  } else {
    assert(compact->outfile == nullptr);
  }
  delete compact->outfile;
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    const CompactionState::Output& out = compact->outputs[i];
    pending_outputs_.erase(out.number);
  }
  delete compact;
}